

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

boolean block_entry(xchar x,xchar y)

{
  char cVar1;
  char cVar2;
  boolean bVar3;
  int iVar4;
  char *pcVar5;
  monst *mtmp;
  obj *poVar6;
  char *pcVar7;
  bool bVar8;
  monst *shkp;
  int roomno;
  xchar sy;
  xchar sx;
  xchar y_local;
  xchar x_local;
  
  if ((level->locations[u.ux][u.uy].typ != '\x17') ||
     ((*(uint *)&level->locations[u.ux][u.uy].field_0x6 >> 4 & 0x1f) != 1)) {
    return '\0';
  }
  pcVar5 = in_rooms(level,x,y,0x12);
  cVar1 = *pcVar5;
  if ((cVar1 < 0) || (level->rooms[(int)cVar1].rtype < '\x12')) {
    return '\0';
  }
  mtmp = shop_keeper(level,cVar1);
  if ((mtmp == (monst *)0x0) || (iVar4 = inhishop(mtmp), iVar4 == 0)) {
    return '\0';
  }
  if (((char)mtmp[0x1b].mintrinsics == u.ux) &&
     (*(char *)((long)&mtmp[0x1b].mintrinsics + 1) == u.uy)) {
    cVar1 = (char)mtmp[0x1b].movement;
    cVar2 = *(char *)((long)&mtmp[0x1b].movement + 1);
    if ((((((mtmp->mx == cVar1) && (mtmp->my == cVar2)) &&
          ((*(uint *)&mtmp->field_0x60 >> 0x12 & 1) != 0)) &&
         ((*(uint *)&mtmp->field_0x60 >> 0x13 & 1) == 0)) &&
        ((((int)x == cVar1 + -1 || ((int)x == cVar1 + 1)) ||
         (((int)y == cVar2 + -1 || ((int)y == cVar2 + 1)))))) &&
       (((((u.uprops[0xd].intrinsic != 0 || (u.uprops[0xd].extrinsic != 0)) ||
          ((youmonst.data == mons + 0x9e || (youmonst.data == mons + 0x7b)))) &&
         (u.uprops[0xd].blocked == 0)) ||
        (((bVar3 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level), bVar3 == '\0' &&
          ((poVar6 = carrying(0x108), poVar6 != (obj *)0x0 ||
           (poVar6 = carrying(0x33), poVar6 != (obj *)0x0)))) || (u.usteed != (monst *)0x0)))))) {
      pcVar5 = shkname(mtmp);
      if ((((u.uprops[0xd].intrinsic != 0) || (u.uprops[0xd].extrinsic != 0)) ||
          (youmonst.data == mons + 0x9e)) || (bVar8 = false, youmonst.data == mons + 0x7b)) {
        bVar8 = u.uprops[0xd].blocked == 0;
      }
      pcVar7 = "";
      if (bVar8) {
        pcVar7 = " senses your motion and";
      }
      pline("%s%s blocks your way!",pcVar5,pcVar7);
      return '\x01';
    }
    return '\0';
  }
  return '\0';
}

Assistant:

boolean block_entry(xchar x, xchar y)
{
	xchar sx, sy;
	int roomno;
	struct monst *shkp;

	if (!(IS_DOOR(level->locations[u.ux][u.uy].typ) &&
		level->locations[u.ux][u.uy].doormask == D_BROKEN)) return FALSE;

	roomno = *in_rooms(level, x, y, SHOPBASE);
	if (roomno < 0 || !IS_SHOP(level, roomno)) return FALSE;
	if (!(shkp = shop_keeper(level, (char)roomno)) || !inhishop(shkp))
		return FALSE;

	if (ESHK(shkp)->shd.x != u.ux || ESHK(shkp)->shd.y != u.uy)
		return FALSE;

	sx = ESHK(shkp)->shk.x;
	sy = ESHK(shkp)->shk.y;

	if (shkp->mx == sx && shkp->my == sy
		&& shkp->mcanmove && !shkp->msleeping
		&& (x == sx-1 || x == sx+1 || y == sy-1 || y == sy+1)
		&& (Invis ||
		    (!Is_blackmarket(&u.uz) &&
		     (carrying(PICK_AXE) || carrying(DWARVISH_MATTOCK))) ||
		    u.usteed)) {
		pline("%s%s blocks your way!", shkname(shkp),
				Invis ? " senses your motion and" : "");
		return TRUE;
	}
	return FALSE;
}